

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  undefined1 *puVar2;
  char cVar3;
  i16 iVar4;
  uint uVar5;
  Parse *pParse;
  sqlite3 *db;
  VTable *pVVar6;
  sqlite3 *psVar7;
  ExprList *pEVar8;
  SrcList *pSrc;
  Column *pCVar9;
  u16 uVar10;
  byte bVar11;
  u32 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  With *pWVar16;
  ulong uVar17;
  Select *pSVar18;
  Table *pTVar19;
  CteUse *pPtr;
  void *pvVar20;
  char *pcVar21;
  IdList *pIVar22;
  Expr *pEVar23;
  ExprList *pEVar24;
  Expr *pEVar25;
  byte bVar26;
  Select *pSVar27;
  SrcItem *pSVar28;
  SrcItem *pSVar29;
  int *piVar30;
  int iVar31;
  uint uVar32;
  SrcList *pSVar33;
  ExprList *pEList;
  char *pcVar34;
  ushort uVar35;
  Select *pSVar36;
  long lVar37;
  ExprList_item *pEVar38;
  long lVar39;
  ExprList_item *pEVar40;
  bool bVar41;
  bool bVar42;
  ExprList *local_110;
  Select *local_100;
  SrcItem *local_e8;
  int iLeft;
  Select *local_d8;
  Expr *local_d0;
  int local_c4;
  char *local_c0;
  Select *local_b8;
  undefined8 local_b0;
  anon_union_8_2_443a03b8_for_u *local_a8;
  uint local_9c;
  int local_98;
  int local_94;
  SrcList *local_90;
  uint local_84;
  ExprList *local_80;
  Expr *local_78;
  ExprList *local_70;
  char *local_68;
  ExprList_item *local_60;
  int *local_58;
  int *local_50;
  long local_48;
  SrcItem *local_40;
  ulong local_38;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar5 = p->selFlags;
  p->selFlags = uVar5 | 0x40;
  local_c4 = 2;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar5 & 0x40) != 0) {
    return 1;
  }
  if (pWalker->eCode != 0) {
    uVar12 = pParse->nSelect + 1;
    pParse->nSelect = uVar12;
    p->selId = uVar12;
  }
  local_80 = p->pEList;
  local_90 = p->pSrc;
  pWVar16 = p->pWith;
  if ((uVar5 >> 0x15 & 1) == 0 || pParse->pWith == (With *)0x0) {
    if (pWVar16 != (With *)0x0) goto LAB_0019d5da;
  }
  else {
    if (pWVar16 == (With *)0x0) {
      pWVar16 = (With *)sqlite3DbMallocZero(db,0x40);
      p->pWith = pWVar16;
      if (pWVar16 == (With *)0x0) {
        return local_c4;
      }
    }
    pWVar16->bView = 1;
LAB_0019d5da:
    if (pParse->nErr == 0) {
      pWVar16->pOuter = pParse->pWith;
      pParse->pWith = pWVar16;
    }
  }
  pSVar33 = local_90;
  sqlite3SrcListAssignCursors(pParse,local_90);
  pSVar29 = pSVar33->a;
  iVar31 = 0;
  local_d8 = p;
  local_40 = pSVar29;
LAB_0019d623:
  if (iVar31 < local_90->nSrc) {
    if (pSVar29->pTab == (Table *)0x0) {
      pcVar34 = pSVar29->zName;
      if (pcVar34 == (char *)0x0) {
        iVar13 = sqlite3WalkSelect(pWalker,pSVar29->pSelect);
        if (iVar13 != 0) {
          return local_c4;
        }
        pSVar18 = pSVar29->pSelect;
        pTVar19 = (Table *)sqlite3DbMallocZero(pParse->db,0x68);
        pSVar29->pTab = pTVar19;
        if (pTVar19 == (Table *)0x0) {
          return local_c4;
        }
        pTVar19->nTabRef = 1;
        if (pSVar29->zAlias == (char *)0x0) {
          pcVar21 = sqlite3MPrintf(pParse->db,"%!S",pSVar29);
        }
        else {
          pcVar21 = sqlite3DbStrDup(pParse->db,pSVar29->zAlias);
        }
        pTVar19->zName = pcVar21;
        do {
          pSVar36 = pSVar18;
          pSVar18 = pSVar36->pPrior;
        } while (pSVar18 != (Select *)0x0);
        sqlite3ColumnsFromExprList(pParse,pSVar36->pEList,&pTVar19->nCol,&pTVar19->aCol);
        pTVar19->iPKey = -1;
        pTVar19->nRowLogEst = 200;
        pbVar1 = (byte *)((long)&pTVar19->tabFlags + 1);
        *pbVar1 = *pbVar1 | 0x42;
        p = local_d8;
        if (pParse->nErr != 0) {
          return local_c4;
        }
      }
      else {
        pWVar16 = pParse->pWith;
        if ((((pWVar16 != (With *)0x0) && (pParse->nErr == 0)) &&
            (pSVar29->zDatabase == (char *)0x0)) && (((pSVar29->fg).field_0x2 & 2) == 0)) {
          for (; pWVar16 != (With *)0x0; pWVar16 = pWVar16->pOuter) {
            uVar17 = (ulong)(uint)pWVar16->nCte;
            if (pWVar16->nCte < 1) {
              uVar17 = 0;
            }
            lVar37 = 0;
            while (lVar39 = lVar37, uVar17 * 0x30 + 0x30 != lVar39 + 0x30) {
              pcVar21 = *(char **)((long)&pWVar16->a[0].zName + lVar39);
              iVar13 = sqlite3StrICmp(pcVar34,pcVar21);
              lVar37 = lVar39 + 0x30;
              if (iVar13 == 0) {
                pcVar34 = *(char **)((long)&pWVar16->a[0].zCteErr + lVar39);
                if (pcVar34 != (char *)0x0) goto LAB_0019e0ca;
                psVar7 = pParse->db;
                iVar13 = cannotBeFunction(pParse,pSVar29);
                if (iVar13 != 0) {
                  return local_c4;
                }
                pTVar19 = (Table *)sqlite3DbMallocZero(psVar7,0x68);
                p = local_d8;
                if (pTVar19 == (Table *)0x0) {
                  return local_c4;
                }
                pPtr = *(CteUse **)((long)&pWVar16->a[0].pUse + lVar39);
                if (pPtr == (CteUse *)0x0) {
                  pPtr = (CteUse *)sqlite3DbMallocZero(psVar7,0x14);
                  *(CteUse **)((long)&pWVar16->a[0].pUse + lVar39) = pPtr;
                  if ((pPtr == (CteUse *)0x0) ||
                     (pvVar20 = sqlite3ParserAddCleanup(pParse,sqlite3DbFree,pPtr),
                     pvVar20 == (void *)0x0)) {
                    sqlite3DbFreeNN(psVar7,pTVar19);
                    return local_c4;
                  }
                  pPtr->eM10d = (&pWVar16->a[0].eM10d)[lVar39];
                }
                pSVar29->pTab = pTVar19;
                pTVar19->nTabRef = 1;
                pcVar21 = sqlite3DbStrDup(psVar7,*(char **)((long)&pWVar16->a[0].zName + lVar39));
                pTVar19->zName = pcVar21;
                pTVar19->iPKey = -1;
                pTVar19->nRowLogEst = 200;
                pbVar1 = (byte *)((long)&pTVar19->tabFlags + 1);
                *pbVar1 = *pbVar1 | 0x42;
                local_100 = sqlite3SelectDup(psVar7,*(Select **)
                                                     ((long)&pWVar16->a[0].pSelect + lVar39),0);
                pSVar29->pSelect = local_100;
                if (psVar7->mallocFailed != '\0') {
                  return local_c4;
                }
                pbVar1 = (byte *)((long)&local_100->selFlags + 3);
                *pbVar1 = *pbVar1 | 4;
                uVar35 = *(ushort *)&(pSVar29->fg).field_0x1;
                if ((uVar35 & 2) != 0) {
                  pcVar21 = (pSVar29->u1).zIndexedBy;
                  pcVar34 = "no such index: \"%s\"";
                  goto LAB_0019e0ca;
                }
                *(ushort *)&(pSVar29->fg).field_0x1 = uVar35 | 0x100;
                (pSVar29->u2).pCteUse = pPtr;
                iVar13 = pPtr->nUse;
                pPtr->nUse = iVar13 + 1;
                if ((0 < iVar13) && (pPtr->eM10d == '\x01')) {
                  pPtr->eM10d = '\0';
                }
                bVar11 = local_100->op;
                local_a8 = (anon_union_8_2_443a03b8_for_u *)
                           (CONCAT71(local_a8._1_7_,bVar11) & 0xfffffffffffffffe);
                pSVar18 = local_100;
                if ((bVar11 & 0xfe) != 0x86) goto LAB_0019db6f;
                iVar13 = -1;
                bVar26 = bVar11;
                local_b8 = local_100;
                goto LAB_0019da6f;
              }
            }
            p = local_d8;
            if (pWVar16->bView != 0) break;
          }
        }
        pTVar19 = sqlite3LocateTableItem(pParse,0,pSVar29);
        pSVar29->pTab = pTVar19;
        if (pTVar19 == (Table *)0x0) {
          return local_c4;
        }
        if (0xfffe < pTVar19->nTabRef) {
          sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar19->zName);
          pSVar29->pTab = (Table *)0x0;
          return local_c4;
        }
        pTVar19->nTabRef = pTVar19->nTabRef + 1;
        if (pTVar19->eTabType != '\x01') {
          iVar13 = cannotBeFunction(pParse,pSVar29);
          if (iVar13 != 0) {
            return local_c4;
          }
          if (pTVar19->eTabType == '\0') goto LAB_0019d8cd;
        }
        uVar10 = pWalker->eCode;
        iVar13 = sqlite3ViewGetColumnNames(pParse,pTVar19);
        if (iVar13 != 0) {
          return local_c4;
        }
        if (pTVar19->eTabType == '\x01') {
          if (((((pSVar29->fg).field_0x1 & 0x80) != 0) &&
              (pVVar6 = (pTVar19->u).vtab.p, pVVar6 != (VTable *)0x0)) &&
             (((uint)db->flags >> 7 & 1) < (uint)pVVar6->eVtabRisk)) {
            sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTVar19->zName);
          }
        }
        else if (pTVar19->eTabType == '\x02') {
          if (((db->flags & 0x80000000) == 0) && (pTVar19->pSchema != db->aDb[1].pSchema)) {
            sqlite3ErrorMsg(pParse,"access to view \"%s\" prohibited",pTVar19->zName);
          }
          pSVar18 = sqlite3SelectDup(db,(pTVar19->u).view.pSelect,0);
          pSVar29->pSelect = pSVar18;
        }
        iVar4 = pTVar19->nCol;
        pTVar19->nCol = -1;
        pWalker->eCode = 1;
        sqlite3WalkSelect(pWalker,pSVar29->pSelect);
        pWalker->eCode = (ushort)(byte)uVar10;
        pTVar19->nCol = iVar4;
        p = local_d8;
      }
      goto LAB_0019d8cd;
    }
    goto LAB_0019d8e6;
  }
  if (pParse->nErr != 0) {
    return local_c4;
  }
  pSrc = p->pSrc;
  pSVar29 = pSrc->a;
  pSVar33 = pSrc + 1;
  pSVar28 = pSVar29;
  for (iVar31 = 0; iVar31 < pSrc->nSrc + -1; iVar31 = iVar31 + 1) {
    pTVar19 = (Table *)pSVar33->a[0].zAlias;
    local_b0 = pSVar28;
    if (pTVar19 != (Table *)0x0 && pSVar28->pTab != (Table *)0x0) {
      iVar13 = pSVar33->a[0].regReturn;
      local_c0 = (char *)CONCAT44(local_c0._4_4_,((iVar13 & 0x20) == 0) + 1);
      if ((iVar13 & 4) != 0) {
        if (((pSVar33->a[0].regReturn & 0x40000) != 0) || (*(long *)&pSVar33->a[0].iCursor != 0)) {
          sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
          return local_c4;
        }
        lVar37 = 0;
        local_110 = (ExprList *)0x0;
        for (lVar39 = 0; lVar39 < pTVar19->nCol; lVar39 = lVar39 + 1) {
          if ((*(byte *)((long)&pTVar19->aCol->colFlags + lVar37) & 2) == 0) {
            pcVar21 = *(char **)((long)&pTVar19->aCol->zCnName + lVar37);
            iVar13 = tableAndColumnIndex(pSrc,0,iVar31,pcVar21,(int *)0x0,(int *)0x0,1);
            if (iVar13 != 0) {
              pIVar22 = sqlite3IdListAppend(pParse,(IdList *)local_110,(Token *)0x0);
              local_110 = (ExprList *)0x0;
              if (pIVar22 != (IdList *)0x0) {
                pcVar21 = sqlite3DbStrDup(pParse->db,pcVar21);
                pIVar22->a[(long)pIVar22->nId + -1].zName = pcVar21;
                local_110 = (ExprList *)pIVar22;
              }
            }
          }
          lVar37 = lVar37 + 0x10;
        }
        if (local_110 != (ExprList *)0x0) {
          pbVar1 = (byte *)((long)&pSVar33->a[0].regReturn + 2);
          *pbVar1 = *pbVar1 | 0x14;
          *(ExprList **)&pSVar33->a[0].iCursor = local_110;
        }
        if (pParse->nErr != 0) {
          return local_c4;
        }
      }
      pEVar23 = *(Expr **)&pSVar33->a[0].iCursor;
      if ((pSVar33->a[0].regReturn & 0x40000) == 0) {
        if (pEVar23 != (Expr *)0x0) {
          sqlite3SetJoinExpr(pEVar23,pSVar33->a[0].regResult,(u32)local_c0);
          pSVar18 = local_d8;
          pEVar23 = sqlite3ExprAnd(pParse,local_d8->pWhere,*(Expr **)&pSVar33->a[0].iCursor);
          pSVar18->pWhere = pEVar23;
          *(undefined8 *)&pSVar33->a[0].iCursor = 0;
          pbVar1 = (byte *)((long)&pSVar33->a[0].regReturn + 2);
          *pbVar1 = *pbVar1 | 8;
        }
      }
      else {
        psVar7 = pParse->db;
        local_a8 = &pEVar23->u;
        local_98 = iVar31 + 1;
        local_d0 = pEVar23;
        for (lVar37 = 0; iVar13._0_1_ = local_d0->op, iVar13._1_1_ = local_d0->affExpr,
            iVar13._2_1_ = local_d0->op2, iVar13._3_1_ = local_d0->field_0x3, lVar37 < iVar13;
            lVar37 = lVar37 + 1) {
          pcVar21 = local_a8[lVar37 * 2].zToken;
          iVar13 = sqlite3ColumnIndex(pTVar19,pcVar21);
          local_b8 = (Select *)CONCAT44(local_b8._4_4_,iVar13);
          if ((iVar13 < 0) ||
             (iVar14 = tableAndColumnIndex(pSrc,0,iVar31,pcVar21,&iLeft,&local_94,
                                           *(ushort *)((long)&pSVar33->a[0].regReturn + 1) >> 0xc &
                                           1), iVar13 = local_94, iVar14 == 0)) {
            pcVar34 = "cannot join using column %s - column not present in both tables";
LAB_0019e0ca:
            sqlite3ErrorMsg(pParse,pcVar34,pcVar21);
            return local_c4;
          }
          pEVar23 = sqlite3CreateColumnExpr(psVar7,pSrc,iLeft,local_94);
          sqlite3SrcItemColumnUsed(pSVar29 + iLeft,iVar13);
          if ((pSrc->a[0].fg.jointype & 0x40) != 0) {
            pEVar24 = (ExprList *)0x0;
            while (iVar13 = tableAndColumnIndex(pSrc,iLeft + 1,iVar31,pcVar21,&iLeft,&local_94,
                                                *(ushort *)((long)&pSVar33->a[0].regReturn + 1) >>
                                                0xc & 1), iVar13 != 0) {
              if (((pSrc->a[iLeft].fg.field_0x2 & 4) == 0) ||
                 (iVar13 = sqlite3IdListIndex(pSVar29[iLeft].u3.pUsing,pcVar21), iVar13 < 0)) {
                sqlite3ErrorMsg(pParse,"ambiguous reference to %s in USING()",pcVar21);
                break;
              }
              pEVar24 = sqlite3ExprListAppend(pParse,pEVar24,pEVar23);
              iVar13 = local_94;
              pEVar23 = sqlite3CreateColumnExpr(psVar7,pSrc,iLeft,local_94);
              sqlite3SrcItemColumnUsed(pSVar29 + iLeft,iVar13);
            }
            if (pEVar24 != (ExprList *)0x0) {
              pEVar24 = sqlite3ExprListAppend(pParse,pEVar24,pEVar23);
              pEVar23 = sqlite3ExprFunction(pParse,pEVar24,(Token *)sqlite3ProcessJoin_tkCoalesce,0)
              ;
            }
          }
          iVar13 = (int)local_b8;
          pEVar25 = sqlite3CreateColumnExpr(psVar7,pSrc,local_98,(int)local_b8);
          sqlite3SrcItemColumnUsed((SrcItem *)pSVar33,iVar13);
          pEVar23 = sqlite3PExpr(pParse,0x35,pEVar23,pEVar25);
          pSVar18 = local_d8;
          if (pEVar23 != (Expr *)0x0) {
            pEVar23->flags = pEVar23->flags | (u32)local_c0;
            pEVar23->w = (anon_union_4_2_009eaf8f_for_w)pEVar25->iTable;
          }
          pEVar23 = sqlite3ExprAnd(pParse,local_d8->pWhere,pEVar23);
          pSVar18->pWhere = pEVar23;
        }
      }
    }
    pSVar33 = (SrcList *)&pSVar33->a[0].u2;
    pSVar28 = local_b0 + 1;
  }
  uVar15 = local_80->nExpr;
  pEVar40 = local_80->a;
  lVar37 = 0;
  uVar17 = 0;
  if (0 < (int)uVar15) {
    uVar17 = (ulong)uVar15;
  }
  uVar32 = 0;
  for (; pSVar18 = local_d8, uVar17 * 0x18 - lVar37 != 0; lVar37 = lVar37 + 0x18) {
    pcVar21 = *(char **)((long)&local_80->a[0].pExpr + lVar37);
    cVar3 = *pcVar21;
    if (cVar3 == -0x73) {
      cVar3 = **(char **)(pcVar21 + 0x18);
    }
    if (cVar3 == -0x4c) {
      local_38 = (ulong)((uint)pParse->db->flags & 0x44);
      local_50 = &local_90[1].a[0].iCursor;
      lVar37 = 0;
      local_110 = (ExprList *)0x0;
      pEVar24 = local_80;
      local_60 = pEVar40;
      goto LAB_0019e172;
    }
    uVar32 = uVar32 | *(uint *)(pcVar21 + 4);
  }
  local_110 = local_d8->pEList;
LAB_0019e8c6:
  if (local_110 != (ExprList *)0x0) {
    if (db->aLimit[2] < local_110->nExpr) {
      sqlite3ErrorMsg(pParse,"too many columns in result set");
      return local_c4;
    }
    if ((uVar32 & 0x400008) != 0) {
      pbVar1 = (byte *)((long)&pSVar18->selFlags + 2);
      *pbVar1 = *pbVar1 | 4;
    }
  }
  return 0;
LAB_0019e172:
  if ((int)uVar15 <= lVar37) goto LAB_0019e8ba;
  local_78 = pEVar40[lVar37].pExpr;
  uVar32 = uVar32 | local_78->flags;
  local_48 = lVar37;
  if (local_78->op == 0xb4) {
    pcVar21 = (char *)0x0;
LAB_0019e253:
    local_b0 = (SrcItem *)((ulong)local_b0 & 0xffffffff00000000);
    local_58 = local_50;
    local_e8 = local_40;
    local_d0 = (Expr *)0x0;
    pSVar18 = local_d8;
    local_c0 = pcVar21;
    local_9c = uVar32;
    while (pEVar40 = local_60, pEVar24 = local_80, uVar32 = local_9c, iVar31 = local_90->nSrc,
          (int)local_d0 < iVar31) {
      local_a8 = (anon_union_8_2_443a03b8_for_u *)local_e8->zAlias;
      pTVar19 = local_e8->pTab;
      if (local_a8 == (anon_union_8_2_443a03b8_for_u *)0x0) {
        local_a8 = (anon_union_8_2_443a03b8_for_u *)pTVar19->zName;
      }
      if (db->mallocFailed != '\0') break;
      if (((local_e8->fg).field_0x2 & 0x20) == 0) {
        if ((pcVar21 == (char *)0x0) ||
           (iVar13 = sqlite3StrICmp(pcVar21,(char *)&local_a8->iValue), iVar13 == 0)) {
          uVar15 = sqlite3SchemaToIndex(db,pTVar19->pSchema);
          if ((int)uVar15 < 0) {
            local_68 = "*";
          }
          else {
            local_68 = db->aDb[uVar15].zDbSName;
          }
          local_70 = (ExprList *)0x0;
          goto LAB_0019e382;
        }
        uVar15 = (int)local_d0 + 1;
      }
      else {
        local_70 = local_e8->pSelect->pEList;
        local_68 = (char *)0x0;
LAB_0019e382:
        local_84 = (int)local_d0 + 1;
        if (((int)local_84 < iVar31) &&
           ((*(byte *)((long)(local_e8 + 1) + 0x3e) & 4) != 0 && (uVar5 >> 0xb & 1) != 0)) {
          local_b8 = *(Select **)((long)(local_e8 + 1) + 0x48);
          piVar30 = &local_b8->iLimit;
          for (lVar37 = 0; iVar31._0_1_ = local_b8->op, iVar31._1_1_ = local_b8->field_0x1,
              iVar31._2_2_ = local_b8->nSelectRow, pcVar21 = local_c0, lVar37 < iVar31;
              lVar37 = lVar37 + 1) {
            pcVar21 = *(char **)piVar30;
            pEVar23 = sqlite3Expr(db,0x3b,pcVar21);
            local_110 = sqlite3ExprListAppend(pParse,local_110,pEVar23);
            if (local_110 != (ExprList *)0x0) {
              lVar39 = (long)local_110->nExpr;
              pcVar21 = sqlite3MPrintf(db,"..%s",pcVar21);
              local_110->a[lVar39 + -1].zEName = pcVar21;
              *(ushort *)&local_110->a[lVar39 + -1].fg.field_0x1 =
                   *(ushort *)&local_110->a[lVar39 + -1].fg.field_0x1 & 0xff7c | 0x82;
            }
            piVar30 = piVar30 + 4;
          }
        }
        else {
          local_b8 = (Select *)0x0;
        }
        pEVar24 = local_70;
        bVar41 = pcVar21 == (char *)0x0;
        bVar42 = local_70 == (ExprList *)0x0;
        local_98 = CONCAT31(local_98._1_3_,
                            ((uVar5 >> 0xb & 1) == 0 && bVar41) && (uint)local_d0 != 0);
        local_d0 = (Expr *)(ulong)~(uint)local_d0;
        for (lVar37 = 0; pSVar18 = local_d8, uVar15 = local_84, lVar37 < pTVar19->nCol;
            lVar37 = lVar37 + 1) {
          pCVar9 = pTVar19->aCol;
          pcVar34 = pCVar9[lVar37].zCnName;
          if ((((bVar42 || bVar41) ||
               (iVar31 = sqlite3MatchEName(pEVar24->a + lVar37,(char *)0x0,pcVar21,(char *)0x0),
               iVar31 != 0)) &&
              ((uVar35 = pCVar9[lVar37].colFlags, (local_d8->selFlags & 0x20000) != 0 ||
               ((uVar35 & 2) == 0)))) &&
             ((((uVar5 >> 0xb & 1) == 0 && pcVar21 == (char *)0x0) & (byte)(uVar35 >> 10) & 1) == 0)
             ) {
            if ((((char)local_98 == '\0') || (((local_e8->fg).field_0x2 & 4) == 0)) ||
               (iVar31 = sqlite3IdListIndex((local_e8->u3).pUsing,pcVar34), iVar31 < 0)) {
              pEVar23 = sqlite3Expr(db,0x3b,pcVar34);
              if (local_90->nSrc < 2) {
LAB_0019e5df:
                if (1 < pParse->eParseMode) goto LAB_0019e5f1;
              }
              else {
                if (((local_e8->fg).jointype >> 6 & (uVar5 >> 0xb & 1) == 0) == 1) {
                  piVar30 = local_58;
                  for (iVar31 = local_90->nSrc + (int)local_d0; 0 < iVar31; iVar31 = iVar31 + -1) {
                    if ((((*piVar30 & 0x4000000000000) != 0) &&
                        (*(IdList **)piVar30 != (IdList *)0x0)) &&
                       (iVar13 = sqlite3IdListIndex(*(IdList **)piVar30,pcVar34), -1 < iVar13))
                    goto LAB_0019e5df;
                    piVar30 = piVar30 + 0x1a;
                  }
                }
LAB_0019e5f1:
                pEVar25 = sqlite3Expr(db,0x3b,(char *)&local_a8->iValue);
                pEVar23 = sqlite3PExpr(pParse,0x8d,pEVar25,pEVar23);
                if ((1 < pParse->eParseMode) && (local_78->pLeft != (Expr *)0x0)) {
                  sqlite3RenameTokenRemap(pParse,pEVar25,local_78->pLeft);
                }
                if (local_68 != (char *)0x0) {
                  pEVar25 = sqlite3Expr(db,0x3b,local_68);
                  pEVar23 = sqlite3PExpr(pParse,0x8d,pEVar25,pEVar23);
                }
              }
              local_110 = sqlite3ExprListAppend(pParse,local_110,pEVar23);
              if (local_110 == (ExprList *)0x0) {
                local_110 = (ExprList *)0x0;
                local_b0 = (SrcItem *)CONCAT44(local_b0._4_4_,1);
                pSVar18 = local_d8;
                pcVar21 = local_c0;
                uVar15 = local_84;
                break;
              }
              lVar39 = (long)local_110->nExpr;
              if (((uVar5 >> 0xb & 1) == 0) || (1 < pParse->eParseMode)) {
                if ((int)local_38 == 4) {
                  pcVar21 = sqlite3MPrintf(db,"%s.%s",local_a8);
                }
                else {
                  pcVar21 = sqlite3DbStrDup(db,pcVar34);
                }
                local_110->a[lVar39 + -1].zEName = pcVar21;
                puVar2 = &local_110->a[lVar39 + -1].fg.field_0x1;
                *puVar2 = *puVar2 & 0xfc;
                goto LAB_0019e700;
              }
              if (local_70 == (ExprList *)0x0) {
                pcVar21 = sqlite3MPrintf(db,"%s.%s.%s",local_68,local_a8,pcVar34);
              }
              else {
                pcVar21 = sqlite3DbStrDup(db,pEVar24->a[lVar37].zEName);
              }
              local_110->a[lVar39 + -1].zEName = pcVar21;
              uVar35 = *(ushort *)&local_110->a[lVar39 + -1].fg.field_0x1 & 0xfffc;
              *(ushort *)&local_110->a[lVar39 + -1].fg.field_0x1 = uVar35 + 2;
              if ((((((local_e8->fg).field_0x2 & 4) != 0) &&
                   (iVar31 = sqlite3IdListIndex((local_e8->u3).pUsing,pcVar34), -1 < iVar31)) ||
                  ((local_b8 != (Select *)0x0 &&
                   (iVar31 = sqlite3IdListIndex((IdList *)local_b8,pcVar34), -1 < iVar31)))) ||
                 ((pTVar19->aCol[lVar37].colFlags & 0x400) != 0)) {
                *(ushort *)&local_110->a[lVar39 + -1].fg.field_0x1 = uVar35 | 0x102;
              }
            }
            else {
LAB_0019e700:
            }
            local_b0 = (SrcItem *)CONCAT44(local_b0._4_4_,1);
            pcVar21 = local_c0;
          }
        }
      }
      local_e8 = local_e8 + 1;
      local_58 = local_58 + 0x1a;
      local_d0 = (Expr *)(ulong)uVar15;
    }
    if ((int)local_b0 == 0) {
      if (pcVar21 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified",0);
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s",pcVar21);
      }
    }
  }
  else {
    if ((local_78->op == 0x8d) && (local_78->pRight->op == 0xb4)) {
      pcVar21 = (local_78->pLeft->u).zToken;
      goto LAB_0019e253;
    }
    pEVar38 = pEVar40 + lVar37;
    local_110 = sqlite3ExprListAppend(pParse,local_110,local_78);
    if (local_110 != (ExprList *)0x0) {
      lVar37 = (long)local_110->nExpr;
      local_110->a[lVar37 + -1].zEName = pEVar38->zEName;
      *(ushort *)&local_110->a[lVar37 + -1].fg.field_0x1 =
           *(ushort *)&local_110->a[lVar37 + -1].fg.field_0x1 & 0xfffc |
           *(ushort *)&(pEVar38->fg).field_0x1 & 3;
      pEVar38->zEName = (char *)0x0;
    }
    pEVar38->pExpr = (Expr *)0x0;
    pSVar18 = local_d8;
    pEVar24 = local_80;
  }
  lVar37 = local_48 + 1;
  uVar15 = pEVar24->nExpr;
  goto LAB_0019e172;
LAB_0019e8ba:
  exprListDeleteNN(db,pEVar24);
  pSVar18->pEList = local_110;
  goto LAB_0019e8c6;
LAB_0019da6f:
  pSVar18 = local_b8;
  if (bVar26 != bVar11) goto LAB_0019db6f;
  pSVar33 = local_100->pSrc;
  uVar17 = (ulong)(uint)pSVar33->nSrc;
  if (pSVar33->nSrc < 1) {
    uVar17 = 0;
  }
  for (lVar37 = 0; uVar17 * 0x68 - lVar37 != 0; lVar37 = lVar37 + 0x68) {
    if (((*(long *)((long)&pSVar33->a[0].zDatabase + lVar37) == 0) &&
        (pcVar21 = *(char **)((long)&pSVar33->a[0].zName + lVar37), pcVar21 != (char *)0x0)) &&
       (iVar14 = sqlite3StrICmp(pcVar21,*(char **)((long)&pWVar16->a[0].zName + lVar39)),
       iVar14 == 0)) {
      *(Table **)((long)&pSVar33->a[0].pTab + lVar37) = pTVar19;
      pTVar19->nTabRef = pTVar19->nTabRef + 1;
      pbVar1 = &pSVar33->a[0].fg.field_0x1 + lVar37;
      *pbVar1 = *pbVar1 | 0x40;
      if ((local_100->selFlags >> 0xd & 1) != 0) {
        pcVar21 = *(char **)((long)&pWVar16->a[0].zName + lVar39);
        pcVar34 = "multiple references to recursive table: %s";
        goto LAB_0019e0ca;
      }
      local_100->selFlags = local_100->selFlags | 0x2000;
      if (iVar13 < 0) {
        iVar13 = pParse->nTab;
        pParse->nTab = iVar13 + 1;
      }
      *(int *)((long)&pSVar33->a[0].iCursor + lVar37) = iVar13;
    }
  }
  p = local_d8;
  pSVar18 = local_b8;
  if ((local_100->selFlags & 0x2000) == 0) goto LAB_0019db6f;
  local_100 = local_100->pPrior;
  bVar26 = local_100->op;
  bVar11 = local_b8->op;
  goto LAB_0019da6f;
LAB_0019db6f:
  *(char **)((long)&pWVar16->a[0].zCteErr + lVar39) = "circular reference: %s";
  local_d0 = (Expr *)pParse->pWith;
  pParse->pWith = pWVar16;
  if ((pSVar18->selFlags & 0x2000) == 0) {
    iVar13 = sqlite3WalkSelect(pWalker,pSVar18);
  }
  else {
    local_100->pWith = pSVar18->pWith;
    iVar13 = sqlite3WalkSelect(pWalker,local_100);
    local_100->pWith = (With *)0x0;
  }
  if (iVar13 != 0) {
    pParse->pWith = (With *)local_d0;
    return local_c4;
  }
  pParse->pWith = pWVar16;
  pSVar36 = pSVar18;
  do {
    pSVar27 = pSVar36;
    pSVar36 = pSVar27->pPrior;
  } while (pSVar36 != (Select *)0x0);
  pEVar24 = pSVar27->pEList;
  pEVar8 = *(ExprList **)((long)&pWVar16->a[0].pCols + lVar39);
  pEList = pEVar24;
  if (((pEVar8 != (ExprList *)0x0) && (pEList = pEVar8, pEVar24 != (ExprList *)0x0)) &&
     (pEVar24->nExpr != pEVar8->nExpr)) {
    sqlite3ErrorMsg(pParse,"table %s has %d values for %d columns",
                    *(undefined8 *)((long)&pWVar16->a[0].zName + lVar39));
    pParse->pWith = (With *)local_d0;
    return local_c4;
  }
  sqlite3ColumnsFromExprList(pParse,pEList,&pTVar19->nCol,&pTVar19->aCol);
  if ((char)local_a8 == -0x7a) {
    pcVar21 = "multiple recursive references: %s";
    if ((pSVar18->selFlags >> 0xd & 1) == 0) {
      pcVar21 = "recursive reference in a subquery: %s";
    }
    *(char **)((long)&pWVar16->a[0].zCteErr + lVar39) = pcVar21;
    sqlite3WalkSelect(pWalker,pSVar18);
  }
  *(undefined8 *)((long)&pWVar16->a[0].zCteErr + lVar39) = 0;
  pParse->pWith = (With *)local_d0;
LAB_0019d8cd:
  if ((((pSVar29->fg).field_0x1 & 2) != 0) &&
     (iVar13 = sqlite3IndexedByLookup(pParse,pSVar29), iVar13 != 0)) {
    return local_c4;
  }
LAB_0019d8e6:
  iVar31 = iVar31 + 1;
  pSVar29 = pSVar29 + 1;
  goto LAB_0019d623;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k, rc;
  SrcList *pTabList;
  ExprList *pEList;
  SrcItem *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  if( pWalker->eCode ){
    /* Renumber selId because it has been copied from a view */
    p->selId = ++pParse->nSelect;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( pParse->pWith && (p->selFlags & SF_View) ){
    if( p->pWith==0 ){
      p->pWith = (With*)sqlite3DbMallocZero(db, sizeof(With));
      if( p->pWith==0 ){
        return WRC_Abort;
      }
    }
    p->pWith->bView = 1;
  }
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->pTab ) continue;
    assert( pFrom->fg.isRecursive==0 );
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
#ifndef SQLITE_OMIT_CTE
    }else if( (rc = resolveFromTermToCte(pParse, pWalker, pFrom))!=0 ){
      if( rc>1 ) return WRC_Abort;
      pTab = pFrom->pTab;
      assert( pTab!=0 );
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
      if( !IsOrdinaryTable(pTab) ){
        i16 nCol;
        u8 eCodeOrig = pWalker->eCode;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        if( IsView(pTab) ){
          if( (db->flags & SQLITE_EnableView)==0
           && pTab->pSchema!=db->aDb[1].pSchema
          ){
            sqlite3ErrorMsg(pParse, "access to view \"%s\" prohibited",
              pTab->zName);
          }
          pFrom->pSelect = sqlite3SelectDup(db, pTab->u.view.pSelect, 0);
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        else if( ALWAYS(IsVirtual(pTab))
         && pFrom->fg.fromDDL
         && ALWAYS(pTab->u.vtab.p!=0)
         && pTab->u.vtab.p->eVtabRisk > ((db->flags & SQLITE_TrustedSchema)!=0)
        ){
          sqlite3ErrorMsg(pParse, "unsafe use of virtual table \"%s\"",
                                  pTab->zName);
        }
        assert( SQLITE_VTABRISK_Normal==1 && SQLITE_VTABRISK_High==2 );
#endif
        nCol = pTab->nCol;
        pTab->nCol = -1;
        pWalker->eCode = 1;  /* Turn on Select.selId renumbering */
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pWalker->eCode = eCodeOrig;
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( pFrom->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  assert( db->mallocFailed==0 || pParse->nErr!=0 );
  if( pParse->nErr || sqlite3ProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zEName = a[k].zEName;
          pNew->a[pNew->nExpr-1].fg.eEName = a[k].fg.eEName;
          a[k].zEName = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;   /* Table for this data source */
          ExprList *pNestedFrom;       /* Result-set of a nested FROM clause */
          char *zTabName;              /* AS name for this data source */
          const char *zSchemaName = 0; /* Schema name for this data source */
          int iDb;                     /* Schema index for this data src */
          IdList *pUsing;              /* USING clause for pFrom[1] */

          if( (zTabName = pFrom->zAlias)==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          assert( (int)pFrom->fg.isNestedFrom == IsNestedFrom(pFrom->pSelect) );
          if( pFrom->fg.isNestedFrom ){
            assert( pFrom->pSelect!=0 );
            pNestedFrom = pFrom->pSelect->pEList;
            assert( pNestedFrom!=0 );
            assert( pNestedFrom->nExpr==pTab->nCol );
          }else{
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            pNestedFrom = 0;
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          if( i+1<pTabList->nSrc
           && pFrom[1].fg.isUsing
           && (selFlags & SF_NestedFrom)!=0
          ){
            int ii;
            pUsing = pFrom[1].u3.pUsing;
            for(ii=0; ii<pUsing->nId; ii++){
              const char *zUName = pUsing->a[ii].zName;
              pRight = sqlite3Expr(db, TK_ID, zUName);
              pNew = sqlite3ExprListAppend(pParse, pNew, pRight);
              if( pNew ){
                struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
                assert( pX->zEName==0 );
                pX->zEName = sqlite3MPrintf(db,"..%s", zUName);
                pX->fg.eEName = ENAME_TAB;
                pX->fg.bUsingTerm = 1;
              }
            }
          }else{
            pUsing = 0;
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zCnName;
            struct ExprList_item *pX; /* Newly added ExprList term */

            assert( zName );
            if( zTName
             && pNestedFrom
             && sqlite3MatchEName(&pNestedFrom->a[j], 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j])
            ){
              continue;
            }
            if( (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
             && zTName==0
             && (selFlags & (SF_NestedFrom))==0
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 && (selFlags & SF_NestedFrom)==0 ){
              if( pFrom->fg.isUsing
               && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0
              ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            if( (pTabList->nSrc>1
                 && (  (pFrom->fg.jointype & JT_LTORJ)==0
                     || (selFlags & SF_NestedFrom)!=0
                     || !inAnyUsingClause(zName,pFrom,pTabList->nSrc-i-1)
                    )
                )
             || IN_RENAME_OBJECT
            ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( IN_RENAME_OBJECT && pE->pLeft ){
                sqlite3RenameTokenRemap(pParse, pLeft, pE->pLeft);
              }
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            if( pNew==0 ){
              break;  /* OOM */
            }
            pX = &pNew->a[pNew->nExpr-1];
            assert( pX->zEName==0 );
            if( (selFlags & SF_NestedFrom)!=0 && !IN_RENAME_OBJECT ){
              if( pNestedFrom ){
                pX->zEName = sqlite3DbStrDup(db, pNestedFrom->a[j].zEName);
                testcase( pX->zEName==0 );
              }else{
                pX->zEName = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zName);
                testcase( pX->zEName==0 );
              }
              pX->fg.eEName = ENAME_TAB;
              if( (pFrom->fg.isUsing
                   && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0)
               || (pUsing && sqlite3IdListIndex(pUsing, zName)>=0)
               || (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
              ){
                pX->fg.bNoExpand = 1;
              }
            }else if( longNames ){
              pX->zEName = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
              pX->fg.eEName = ENAME_NAME;
            }else{
              pX->zEName = sqlite3DbStrDup(db, zName);
              pX->fg.eEName = ENAME_NAME;
            }
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After result-set wildcard expansion:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif
  return WRC_Continue;
}